

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O1

Cov_Man_t * Cov_ManAlloc(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax)

{
  size_t __size;
  uint uVar1;
  Cov_Man_t *pCVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  void *__s;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  long lVar8;
  Min_Man_t *pMVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  int iVar12;
  
  if (pNtk->pManCut != (void *)0x0) {
    __assert_fail("pNtk->pManCut == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x33,"Cov_Man_t *Cov_ManAlloc(Abc_Ntk_t *, int, int)");
  }
  iVar12 = nFaninMax;
  pCVar2 = (Cov_Man_t *)malloc(0x78);
  pCVar2->nFaninMax = 0;
  pCVar2->nCubesMax = 0;
  *(undefined8 *)&pCVar2->nWords = 0;
  pCVar2->vFanCounts = (Vec_Int_t *)0x0;
  pCVar2->vObjStrs = (Vec_Ptr_t *)0x0;
  pCVar2->pMemory = (void *)0x0;
  pCVar2->pManMin = (Min_Man_t *)0x0;
  pCVar2->fUseEsop = 0;
  pCVar2->fUseSop = 0;
  pCVar2->vComTo0 = (Vec_Int_t *)0x0;
  pCVar2->vComTo1 = (Vec_Int_t *)0x0;
  pCVar2->vPairs0 = (Vec_Int_t *)0x0;
  pCVar2->vPairs1 = (Vec_Int_t *)0x0;
  pCVar2->vTriv0 = (Vec_Int_t *)0x0;
  pCVar2->vTriv1 = (Vec_Int_t *)0x0;
  pCVar2->nSupps = 0;
  pCVar2->nSuppsMax = 0;
  pCVar2->nBoundary = 0;
  pCVar2->nNodes = 0;
  pCVar2->nFaninMax = nFaninMax;
  pCVar2->nCubesMax = nCubesMax;
  pCVar2->nWords = ((nFaninMax >> 4) + 1) - (uint)((nFaninMax & 0xfU) == 0);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < nFaninMax * 2 - 1U) {
    iVar11 = nFaninMax * 2;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar11 * 4);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vComTo0 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vComTo1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < nFaninMax - 1U) {
    iVar11 = nFaninMax;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar11 * 4);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vPairs0 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vPairs1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  pVVar3->pArray = piVar4;
  pCVar2->vTriv0 = pVVar3;
  Vec_IntPush(pVVar3,iVar12);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  pVVar3->pArray = piVar4;
  pCVar2->vTriv1 = pVVar3;
  Vec_IntPush(pVVar3,iVar12);
  pVVar10 = pNtk->vObjs;
  iVar11 = pVVar10->nSize;
  __s = malloc((long)iVar11 << 10);
  pCVar2->pMemory = __s;
  memset(__s,0,(long)iVar11 << 5);
  iVar11 = pVVar10->nSize;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar12 = 8;
  if (6 < iVar11 - 1U) {
    iVar12 = iVar11;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar12;
  if (iVar12 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar12 << 3);
  }
  pVVar5->pArray = ppvVar6;
  pCVar2->vObjStrs = pVVar5;
  uVar1 = pVVar10->nSize;
  if (iVar12 < (int)uVar1) {
    __size = (long)(int)uVar1 * 8;
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc(__size);
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,__size);
    }
    pVVar5->pArray = ppvVar6;
    pVVar5->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      pVVar5->pArray[uVar7] = (void *)0x0;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  pVVar5->nSize = uVar1;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      if (pVVar10->pArray[lVar8] != (void *)0x0) {
        if ((int)uVar1 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        pVVar5->pArray[lVar8] = __s;
      }
      lVar8 = lVar8 + 1;
      pVVar10 = pNtk->vObjs;
      __s = (void *)((long)__s + 0x20);
    } while (lVar8 < pVVar10->nSize);
  }
  pMVar9 = Min_ManAlloc(nFaninMax);
  pCVar2->pManMin = pMVar9;
  return pCVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cov_Man_t * Cov_ManAlloc( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax )
{
    Cov_Man_t * pMan;
    Cov_Obj_t * pMem;
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->pManCut == NULL );

    // start the manager
    pMan = ABC_ALLOC( Cov_Man_t, 1 );
    memset( pMan, 0, sizeof(Cov_Man_t) );
    pMan->nFaninMax = nFaninMax;
    pMan->nCubesMax = nCubesMax;
    pMan->nWords    = Abc_BitWordNum( nFaninMax * 2 );

    // get the cubes
    pMan->vComTo0 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vComTo1 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vPairs0 = Vec_IntAlloc( nFaninMax );
    pMan->vPairs1 = Vec_IntAlloc( nFaninMax );
    pMan->vTriv0  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv0, -1 ); 
    pMan->vTriv1  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv1, -1 ); 

    // allocate memory for object structures
    pMan->pMemory = pMem = ABC_ALLOC( Cov_Obj_t, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    memset( pMem, 0, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    // allocate storage for the pointers to the memory
    pMan->vObjStrs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrFill( pMan->vObjStrs, Abc_NtkObjNumMax(pNtk), NULL );
    Abc_NtkForEachObj( pNtk, pObj, i )
        Vec_PtrWriteEntry( pMan->vObjStrs, i, pMem + i );
    // create the cube manager
    pMan->pManMin = Min_ManAlloc( nFaninMax );
    return pMan;
}